

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov7_pnnx.cpp
# Opt level: O1

void generate_proposals(Mat *anchors,int stride,Mat *in_pad,Mat *feat_blob,float prob_threshold,
                       vector<Object,_std::allocator<Object>_> *objects)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  float *pfVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  double dVar15;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar16 [16];
  double dVar17;
  float fVar18;
  float fVar19;
  float fVar21;
  undefined1 auVar20 [16];
  ulong local_118;
  long local_108;
  value_type local_a8;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  uVar2 = anchors->w;
  if (1 < (int)uVar2) {
    uVar3 = in_pad->w;
    local_88._0_4_ = (undefined4)stride;
    uVar4 = in_pad->h;
    local_88._4_4_ = local_88._0_4_;
    local_88._8_4_ = local_88._0_4_;
    local_88._12_4_ = local_88._0_4_;
    local_108 = 5;
    local_118 = 0;
    do {
      if (0 < (int)uVar4) {
        lVar7 = local_118 * 0x55;
        uVar1 = *(undefined8 *)((long)anchors->data + local_118 * 8);
        local_78._0_8_ = (undefined8)(float)uVar1;
        local_78._8_8_ = (undefined8)(float)((ulong)uVar1 >> 0x20);
        uVar12 = 0;
        do {
          if (0 < (int)uVar3) {
            local_68 = ZEXT416((uint)(float)(int)uVar12);
            lVar9 = 0;
            uVar10 = 0;
            do {
              pfVar6 = (float *)(((long)in_pad->w * uVar12 + local_108 * in_pad->cstep) *
                                 in_pad->elemsize + lVar9 + (long)in_pad->data);
              uVar8 = 0;
              uVar11 = 0;
              fVar18 = -3.4028235e+38;
              do {
                if (fVar18 < *pfVar6) {
                  uVar11 = uVar8 & 0xffffffff;
                  fVar18 = *pfVar6;
                }
                uVar8 = uVar8 + 1;
                pfVar6 = (float *)((long)pfVar6 + in_pad->cstep * in_pad->elemsize);
              } while (uVar8 != 0x50);
              fVar13 = expf(-*(float *)((long)in_pad->data +
                                       uVar10 * 4 +
                                       (long)in_pad->w * uVar12 * in_pad->elemsize +
                                       in_pad->cstep * (lVar7 + 4) * in_pad->elemsize));
              fVar18 = expf(-fVar18);
              auVar16._4_4_ = fVar18 + DAT_005f00f0._4_4_;
              auVar16._0_4_ = fVar13 + (float)DAT_005f00f0;
              auVar16._8_4_ = extraout_XMM0_Db + DAT_005f00f0._8_4_;
              auVar16._12_4_ = extraout_XMM0_Db_00 + DAT_005f00f0._12_4_;
              auVar16 = divps(_DAT_005f00f0,auVar16);
              fVar18 = auVar16._4_4_ * auVar16._0_4_;
              if (0.25 <= fVar18) {
                fVar13 = expf(-*(float *)((long)in_pad->data +
                                         uVar10 * 4 +
                                         (long)in_pad->w * uVar12 * in_pad->elemsize +
                                         in_pad->cstep * lVar7 * in_pad->elemsize));
                local_48 = expf(-*(float *)((long)in_pad->data +
                                           uVar10 * 4 +
                                           (long)in_pad->w * uVar12 * in_pad->elemsize +
                                           in_pad->cstep * (lVar7 + 1) * in_pad->elemsize));
                fStack_44 = extraout_XMM0_Db_02;
                local_58 = expf(-*(float *)((long)in_pad->data +
                                           uVar10 * 4 +
                                           (long)in_pad->w * uVar12 * in_pad->elemsize +
                                           in_pad->cstep * (lVar7 + 2) * in_pad->elemsize));
                fStack_54 = extraout_XMM0_Db_03;
                fVar14 = expf(-*(float *)((long)in_pad->data +
                                         uVar10 * 4 +
                                         (long)in_pad->w * uVar12 * in_pad->elemsize +
                                         in_pad->cstep * (lVar7 + 3) * in_pad->elemsize));
                auVar20._4_4_ = local_48 + DAT_005f00f0._4_4_;
                auVar20._0_4_ = fVar13 + (float)DAT_005f00f0;
                auVar20._8_4_ = extraout_XMM0_Db_01 + DAT_005f00f0._8_4_;
                auVar20._12_4_ = fStack_44 + DAT_005f00f0._12_4_;
                auVar20 = divps(_DAT_005f00f0,auVar20);
                auVar5._4_4_ = fVar14 + DAT_005f00f0._4_4_;
                auVar5._0_4_ = local_58 + (float)DAT_005f00f0;
                auVar5._8_4_ = fStack_54 + DAT_005f00f0._8_4_;
                auVar5._12_4_ = extraout_XMM0_Db_04 + DAT_005f00f0._12_4_;
                auVar16 = divps(_DAT_005f00f0,auVar5);
                fVar19 = (auVar20._0_4_ + auVar20._0_4_ + -0.5 + (float)(int)uVar10) *
                         (float)local_88._0_4_;
                fVar21 = (auVar20._4_4_ + auVar20._4_4_ + -0.5 + (float)local_68._0_4_) *
                         (float)local_88._4_4_;
                dVar15 = (double)(auVar16._0_4_ + auVar16._0_4_);
                dVar17 = (double)(auVar16._4_4_ + auVar16._4_4_);
                fVar13 = (float)(dVar15 * dVar15 * (double)local_78._0_8_) * 0.5;
                fVar14 = (float)(dVar17 * dVar17 * (double)local_78._8_8_) * 0.5;
                local_a8.rect.x = fVar19 - fVar13;
                local_a8.rect.y = fVar21 - fVar14;
                local_a8.rect.width = (fVar13 + fVar19) - local_a8.rect.x;
                local_a8.rect.height = (fVar14 + fVar21) - local_a8.rect.y;
                local_a8.label = (int)uVar11;
                local_a8.prob = fVar18;
                std::vector<Object,_std::allocator<Object>_>::push_back
                          ((vector<Object,_std::allocator<Object>_> *)feat_blob,&local_a8);
              }
              uVar10 = uVar10 + 1;
              lVar9 = lVar9 + 4;
            } while (uVar10 != uVar3);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar4);
      }
      local_118 = local_118 + 1;
      local_108 = local_108 + 0x55;
    } while (local_118 != uVar2 >> 1);
  }
  return;
}

Assistant:

static void generate_proposals(const ncnn::Mat& anchors, int stride, const ncnn::Mat& in_pad, const ncnn::Mat& feat_blob, float prob_threshold, std::vector<Object>& objects)
{
    const int num_grid_x = feat_blob.w;
    const int num_grid_y = feat_blob.h;

    const int num_anchors = anchors.w / 2;

    const int num_class = 80;

    for (int q = 0; q < num_anchors; q++)
    {
        const float anchor_w = anchors[q * 2];
        const float anchor_h = anchors[q * 2 + 1];

        for (int i = 0; i < num_grid_y; i++)
        {
            for (int j = 0; j < num_grid_x; j++)
            {
                // find class index with max class score
                int class_index = 0;
                float class_score = -FLT_MAX;
                for (int k = 0; k < num_class; k++)
                {
                    float score = feat_blob.channel(q * 85 + 5 + k).row(i)[j];
                    if (score > class_score)
                    {
                        class_index = k;
                        class_score = score;
                    }
                }

                float box_score = feat_blob.channel(q * 85 + 4).row(i)[j];

                float confidence = sigmoid(box_score) * sigmoid(class_score);

                if (confidence >= prob_threshold)
                {
                    // yolov5/models/yolo.py Detect forward
                    // y = x[i].sigmoid()
                    // y[..., 0:2] = (y[..., 0:2] * 2. - 0.5 + self.grid[i].to(x[i].device)) * self.stride[i]  # xy
                    // y[..., 2:4] = (y[..., 2:4] * 2) ** 2 * self.anchor_grid[i]  # wh

                    float dx = sigmoid(feat_blob.channel(q * 85 + 0).row(i)[j]);
                    float dy = sigmoid(feat_blob.channel(q * 85 + 1).row(i)[j]);
                    float dw = sigmoid(feat_blob.channel(q * 85 + 2).row(i)[j]);
                    float dh = sigmoid(feat_blob.channel(q * 85 + 3).row(i)[j]);

                    float pb_cx = (dx * 2.f - 0.5f + j) * stride;
                    float pb_cy = (dy * 2.f - 0.5f + i) * stride;

                    float pb_w = pow(dw * 2.f, 2) * anchor_w;
                    float pb_h = pow(dh * 2.f, 2) * anchor_h;

                    float x0 = pb_cx - pb_w * 0.5f;
                    float y0 = pb_cy - pb_h * 0.5f;
                    float x1 = pb_cx + pb_w * 0.5f;
                    float y1 = pb_cy + pb_h * 0.5f;

                    Object obj;
                    obj.rect.x = x0;
                    obj.rect.y = y0;
                    obj.rect.width = x1 - x0;
                    obj.rect.height = y1 - y0;
                    obj.label = class_index;
                    obj.prob = confidence;

                    objects.push_back(obj);
                }
            }
        }
    }
}